

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::insert
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype i,qsizetype n,parameter_type t)

{
  DayOfWeek *pDVar1;
  GrowthPosition where;
  long lVar2;
  
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<Qt::DayOfWeek>).size != 0);
  QArrayDataPointer<Qt::DayOfWeek>::detachAndGrow
            (&this->super_QArrayDataPointer<Qt::DayOfWeek>,where,n,(DayOfWeek **)0x0,
             (QArrayDataPointer<Qt::DayOfWeek> *)0x0);
  pDVar1 = createHole(this,where,i,n);
  for (lVar2 = 0; n != lVar2; lVar2 = lVar2 + 1) {
    pDVar1[lVar2] = t;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }